

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathCacheWrapNodeSet(xmlXPathContextPtr ctxt,xmlNodeSetPtr val)

{
  int iVar1;
  long *plVar2;
  xmlXPathObjectPtr pxVar3;
  
  if (((ctxt != (xmlXPathContextPtr)0x0) && (ctxt->cache != (void *)0x0)) &&
     (plVar2 = *(long **)((long)ctxt->cache + 0x20), plVar2 != (long *)0x0)) {
    iVar1 = (int)plVar2[1];
    if ((long)iVar1 != 0) {
      *(int *)(plVar2 + 1) = iVar1 + -1;
      pxVar3 = *(xmlXPathObjectPtr *)(*plVar2 + -8 + (long)iVar1 * 8);
      goto LAB_001db3ea;
    }
  }
  pxVar3 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar3 == (xmlXPathObjectPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating node set object\n");
    return (xmlXPathObjectPtr)0x0;
  }
  *(undefined8 *)pxVar3 = 0;
  pxVar3->nodesetval = (xmlNodeSetPtr)0x0;
  *(undefined8 *)&pxVar3->index = 0;
  pxVar3->user2 = (void *)0x0;
  pxVar3->stringval = (xmlChar *)0x0;
  pxVar3->user = (void *)0x0;
  *(undefined8 *)&pxVar3->boolval = 0;
  pxVar3->floatval = 0.0;
  *(undefined8 *)&pxVar3->index2 = 0;
LAB_001db3ea:
  pxVar3->type = XPATH_NODESET;
  pxVar3->nodesetval = val;
  return pxVar3;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapNodeSet(xmlXPathContextPtr ctxt, xmlNodeSetPtr val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];
	    ret->type = XPATH_NODESET;
	    ret->nodesetval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_NODESET);
#endif
	    return(ret);
	}
    }

    return(xmlXPathWrapNodeSet(val));

}